

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeConcepts.hh
# Opt level: O3

shared_ptr<avro::Node> * __thiscall
avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>::get
          (SingleAttribute<boost::shared_ptr<avro::Node>_> *this,size_t index)

{
  undefined8 *puVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (index == 0) {
    return &this->attr_;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"SingleAttribute has only 1 value","");
  std::runtime_error::runtime_error((runtime_error *)(puVar1 + 1),(string *)local_40);
  *puVar1 = 0x190860;
  puVar1[1] = 0x190890;
  __cxa_throw(puVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

const Attribute &get(size_t index = 0) const {
        if (index != 0) {
            throw Exception("SingleAttribute has only 1 value");
        }
        return attr_;
    }